

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>_>_>_>
::val(FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>_>_>_>
      *this)

{
  double dVar1;
  double dVar2;
  FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
  *pFVar3;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *pFVar4;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>_>_>
  *pFVar5;
  FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>_>_>
  *pFVar6;
  FadExpr<FadFuncCos<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_> *pFVar7;
  FadExpr<FadFuncSin<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_> *pFVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  dVar1 = (this->left_->fadexpr_).left_.constant_;
  pFVar3 = (this->left_->fadexpr_).right_;
  pFVar4 = (pFVar3->fadexpr_).expr_.fadexpr_.left_;
  dVar9 = cos(((pFVar4->fadexpr_).left_.constant_ * ((pFVar4->fadexpr_).right_)->val_) /
              (pFVar3->fadexpr_).expr_.fadexpr_.right_.constant_);
  pFVar5 = this->right_;
  pFVar6 = (pFVar5->fadexpr_).left_;
  pFVar7 = (pFVar6->fadexpr_).right_;
  dVar2 = ((((pFVar6->fadexpr_).left_)->fadexpr_).expr_)->val_;
  dVar10 = cos((pFVar7->fadexpr_).expr_.fadexpr_.left_.constant_ -
               ((pFVar7->fadexpr_).expr_.fadexpr_.right_)->val_);
  pFVar8 = (pFVar5->fadexpr_).right_;
  dVar11 = sin((pFVar8->fadexpr_).expr_.fadexpr_.left_.constant_ -
               ((pFVar8->fadexpr_).expr_.fadexpr_.right_)->val_);
  return (dVar11 - dVar10 * dVar2) * dVar9 * dVar1;
}

Assistant:

const value_type val() const {return left_.val() * right_.val() ;}